

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

Abc_Time_t * Abc_NtkGetCoRequiredTimes(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  long *plVar3;
  Abc_Time_t *pAVar4;
  size_t sVar5;
  size_t __nmemb;
  
  pVVar1 = pNtk->vCos;
  __nmemb = (size_t)pVVar1->nSize;
  pAVar4 = (Abc_Time_t *)calloc(__nmemb,8);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0 && 0 < (long)__nmemb) {
    ppvVar2 = pVVar1->pArray;
    sVar5 = 0;
    do {
      plVar3 = (long *)ppvVar2[sVar5];
      pAVar4[sVar5] =
           **(Abc_Time_t **)
             (*(long *)(*(long *)(*(long *)(*plVar3 + 0x108) + 0x18) + 8) + (long)(int)plVar3[2] * 8
             );
      sVar5 = sVar5 + 1;
    } while (__nmemb != sVar5);
  }
  return pAVar4;
}

Assistant:

Abc_Time_t * Abc_NtkGetCoRequiredTimes( Abc_Ntk_t * pNtk )
{
    Abc_Time_t * p;
    Abc_Obj_t * pNode;
    int i;
    p = ABC_CALLOC( Abc_Time_t, Abc_NtkCoNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        return p;
    // set the PO required times
    Abc_NtkForEachCo( pNtk, pNode, i )
        p[i] = *Abc_NodeRequired(pNode);
    return p;
}